

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter.h
# Opt level: O2

NodeRange __thiscall
mp::
FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>
::
AddConstraintAndTryNoteResultVariable<mp::CustomFunctionalConstraint<std::array<int,1ul>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::AsinId>>
          (FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>
           *this,CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AsinId>
                 *con)

{
  ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AsinId>_>
  *this_00;
  int var;
  bool bVar1;
  int i;
  CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AsinId>
  *con_00;
  Error *this_01;
  NodeRange NVar2;
  ConInfo ci;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  var = (con->super_FunctionalConstraint).result_var_;
  this_00 = (ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AsinId>_>
             *)(this + 0x4bf0);
  i = ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::CustomFunctionalConstraint<std::array<int,1ul>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::AsinId>>
      ::
      AddConstraint<mp::CustomFunctionalConstraint<std::array<int,1ul>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::AsinId>>
                ((ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::CustomFunctionalConstraint<std::array<int,1ul>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::AsinId>>
                  *)this_00,*(int *)(this + 0xb30),con);
  ci.pck_ = (BasicConstraintKeeper *)this_00;
  ci.index_ = i;
  if (-1 < var) {
    FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
    ::AddInitExpression((FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                         *)this,var,&ci);
  }
  con_00 = ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AsinId>_>
           ::GetConstraint(this_00,i);
  bVar1 = MapInsert__Impl<mp::CustomFunctionalConstraint<std::array<int,1ul>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::AsinId>>
                    (this,con_00,i);
  if (bVar1) {
    NVar2 = pre::ValueNode::Select((ValueNode *)(this + 0x4bf8),i,1);
    return NVar2;
  }
  this_01 = (Error *)__cxa_allocate_exception(0x18);
  std::operator+(&local_40,"Trying to MapInsert() duplicated constraint: ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (this + 0x4d20));
  Error::Error(this_01,(CStringRef)local_40._M_dataplus._M_p,-1);
  __cxa_throw(this_01,&Error::typeinfo,fmt::SystemError::~SystemError);
}

Assistant:

pre::NodeRange AddConstraintAndTryNoteResultVariable(Constraint&& con) {
    const auto resvar = con.GetResultVar();
    auto& ck = GET_CONSTRAINT_KEEPER( Constraint );
    auto i = ck.AddConstraint(constr_depth_, std::move(con));
    ConInfo ci{&ck, i};
    if (resvar>=0)
      AddInitExpression(resvar, ci);
    /// Can also cache non-functional constraints,
    /// but then implement checking before
    if (! MP_DISPATCH( MapInsert(
                         MPD(template GetConstraint<Constraint>(i)), i ) ))
      MP_RAISE("Trying to MapInsert() duplicated constraint: " +
                             ck.GetDescription());
    return ck.SelectValueNodeRange(i);
  }